

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

size_t lws_buflist_total_len(lws_buflist **head)

{
  undefined8 local_20;
  size_t size;
  lws_buflist *p;
  lws_buflist **head_local;
  
  size = (size_t)*head;
  local_20 = 0;
  for (; size != 0; size = *(size_t *)size) {
    local_20 = *(long *)(size + 8) + local_20;
  }
  return local_20;
}

Assistant:

size_t
lws_buflist_total_len(struct lws_buflist **head)
{
	struct lws_buflist *p = *head;
	size_t size = 0;

	while (p) {
		size += p->len;
		p = p->next;
	}

	return size;
}